

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O3

vector<CMU462::StaticScene::Primitive_*,_std::allocator<CMU462::StaticScene::Primitive_*>_> *
__thiscall
CMU462::StaticScene::SphereObject::get_primitives
          (vector<CMU462::StaticScene::Primitive_*,_std::allocator<CMU462::StaticScene::Primitive_*>_>
           *__return_storage_ptr__,SphereObject *this)

{
  _func_int **pp_Var1;
  Primitive *local_18;
  
  (__return_storage_ptr__->
  super__Vector_base<CMU462::StaticScene::Primitive_*,_std::allocator<CMU462::StaticScene::Primitive_*>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<CMU462::StaticScene::Primitive_*,_std::allocator<CMU462::StaticScene::Primitive_*>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<CMU462::StaticScene::Primitive_*,_std::allocator<CMU462::StaticScene::Primitive_*>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_18 = (Primitive *)operator_new(0x38);
  local_18->_vptr_Primitive = (_func_int **)&PTR_get_bbox_0026b9d8;
  local_18[1]._vptr_Primitive = (_func_int **)this;
  pp_Var1 = (_func_int **)(this->o).y;
  local_18[2]._vptr_Primitive = (_func_int **)(this->o).x;
  local_18[3]._vptr_Primitive = pp_Var1;
  pp_Var1 = (_func_int **)this->r;
  local_18[4]._vptr_Primitive = (_func_int **)(this->o).z;
  local_18[5]._vptr_Primitive = pp_Var1;
  local_18[6]._vptr_Primitive = (_func_int **)((double)pp_Var1 * (double)pp_Var1);
  std::vector<CMU462::StaticScene::Primitive*,std::allocator<CMU462::StaticScene::Primitive*>>::
  emplace_back<CMU462::StaticScene::Primitive*>
            ((vector<CMU462::StaticScene::Primitive*,std::allocator<CMU462::StaticScene::Primitive*>>
              *)__return_storage_ptr__,&local_18);
  return __return_storage_ptr__;
}

Assistant:

std::vector<Primitive*> SphereObject::get_primitives() const {
  std::vector<Primitive*> primitives;
  primitives.push_back(new Sphere(this,o,r));
  return primitives;
}